

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
TempTracker<ObjectTempVerify>::MarkTemp
          (TempTracker<ObjectTempVerify> *this,StackSym *sym,BackwardPass *backwardPass)

{
  Instr *instr_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> **ppBVar5;
  char16 *pcVar6;
  JitArenaAllocator *pJVar7;
  PageAllocator *pageAllocator;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  bool local_109;
  bool local_101;
  undefined1 local_e8 [8];
  JitArenaAllocator tempAllocator;
  bool hasExposedDependencies;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses;
  bool dstIsTempTransferred;
  bool dstIsTemp;
  BVSparse<Memory::JitArenaAllocator> **pBv;
  BVSparse<Memory::JitArenaAllocator> *pBStack_38;
  bool isTransferOperation;
  BVSparse<Memory::JitArenaAllocator> *bvTempTransferDependencies;
  BOOLEAN isTempTransferred;
  BOOLEAN nonTemp;
  Instr *instr;
  BackwardPass *backwardPass_local;
  StackSym *sym_local;
  TempTracker<ObjectTempVerify> *this_local;
  
  bVar2 = StackSym::IsVar(sym);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x133,"(sym->IsVar())","sym->IsVar()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  instr_00 = backwardPass->currentInstr;
  BVar3 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    ((BVSparse<Memory::JitArenaAllocator> *)this,(sym->super_Sym).m_id);
  pBStack_38 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  bVar2 = ObjectTempVerify::IsTempTransfer(instr_00);
  local_101 = true;
  if (!bVar2) {
    bVar2 = ObjectTempVerify::IsTempPropertyTransferLoad
                      (&this->super_ObjectTempVerify,instr_00,backwardPass);
    local_101 = true;
    if (!bVar2) {
      local_101 = ObjectTempVerify::IsTempIndirTransferLoad
                            (&this->super_ObjectTempVerify,instr_00,backwardPass);
    }
  }
  if ((this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies ==
      (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    bvTempTransferDependencies._6_1_ =
         BVSparse<Memory::JitArenaAllocator>::TestAndClear
                   (&(this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferredSyms,
                    (sym->super_Sym).m_id);
  }
  else {
    if (local_101 == false) {
      bvTempTransferDependencies._6_1_ =
           BVSparse<Memory::JitArenaAllocator>::TestAndClear
                     (&(this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferredSyms,
                      (sym->super_Sym).m_id);
    }
    else {
      bvTempTransferDependencies._6_1_ =
           BVSparse<Memory::JitArenaAllocator>::Test
                     (&(this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferredSyms,
                      (sym->super_Sym).m_id);
    }
    if (bvTempTransferDependencies._6_1_ != '\0') {
      bVar2 = BackwardPass::IsPrePass(backwardPass);
      if (bVar2) {
        if (local_101 == false) {
          HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Clear
                    ((this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies,
                     (sym->super_Sym).m_id);
        }
      }
      else if (local_101 == false) {
        pBStack_38 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                     GetAndClear((this->super_ObjectTempVerify).super_TempTrackerBase.
                                 tempTransferDependencies,(sym->super_Sym).m_id);
      }
      else {
        ppBVar5 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                            ((this->super_ObjectTempVerify).super_TempTrackerBase.
                             tempTransferDependencies,(sym->super_Sym).m_id);
        if (ppBVar5 != (BVSparse<Memory::JitArenaAllocator> **)0x0) {
          pBStack_38 = *ppBVar5;
        }
      }
    }
  }
  upwardExposedUses._7_1_ = false;
  upwardExposedUses._6_1_ = false;
  if (BVar3 == '\0') {
    bVar2 = BackwardPass::IsPrePass(backwardPass);
    if (bVar2) {
      bVar2 = ObjectTempVerify::IsTempTransfer(instr_00);
      if (((local_101 != bVar2) &&
          (bVar2 = ObjectTempVerify::IsTempPropertyTransferLoad
                             (&this->super_ObjectTempVerify,instr_00,backwardPass), !bVar2)) &&
         (bVar2 = ObjectTempVerify::IsTempIndirTransferLoad
                            (&this->super_ObjectTempVerify,instr_00,backwardPass), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                           ,400,
                           "(isTransferOperation == T::IsTempTransfer(instr) || T::IsTempPropertyTransferLoad(instr, backwardPass) || T::IsTempIndirTransferLoad(instr, backwardPass))"
                           ,
                           "isTransferOperation == T::IsTempTransfer(instr) || T::IsTempPropertyTransferLoad(instr, backwardPass) || T::IsTempIndirTransferLoad(instr, backwardPass)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      upwardExposedUses._7_1_ = local_101 != false;
    }
    else {
      bVar2 = ObjectTempVerify::CanMarkTemp(instr_00,backwardPass);
      if (((bVar2) && (upwardExposedUses._7_1_ = true, bvTempTransferDependencies._6_1_ != '\0')) &&
         (upwardExposedUses._6_1_ = true, pBStack_38 != (BVSparse<Memory::JitArenaAllocator> *)0x0))
      {
        bVar2 = ObjectTempVerify::DoTrace(backwardPass);
        if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
          pcVar6 = ObjectTempVerify::GetTraceName();
          Output::Print(L"%s: Loop mark temp check instr:\n",pcVar6);
          IR::Instr::DumpSimple(instr_00);
          Output::Print(L"Transfer dependencies: ");
          BVSparse<Memory::JitArenaAllocator>::Dump(pBStack_38);
          Output::Print(L"Upward exposed Uses  : ");
          BVSparse<Memory::JitArenaAllocator>::Dump(backwardPass->currentBlock->upwardExposedUses);
          Output::Print(L"\n");
        }
        pBVar8 = backwardPass->currentBlock->upwardExposedUses;
        bVar2 = BVSparse<Memory::JitArenaAllocator>::Test(pBStack_38,pBVar8);
        local_109 = true;
        if (!bVar2) {
          local_109 = ObjectTempVerify::HasExposedFieldDependencies
                                (&this->super_ObjectTempVerify,pBStack_38,backwardPass);
        }
        tempAllocator.bvFreeList._7_1_ = local_109;
        if (local_109 != false) {
          bVar2 = ObjectTempVerify::DoTrace(backwardPass);
          if (bVar2) {
            pcVar6 = ObjectTempVerify::GetTraceName();
            Output::Print(L"%s: Not temp (s%-03d): ",pcVar6,(ulong)(sym->super_Sym).m_id);
            IR::Instr::DumpSimple(instr_00);
            Output::Print(L"       Transferred exposed uses: ");
            pJVar7 = TempTrackerBase::GetAllocator((TempTrackerBase *)this);
            pageAllocator =
                 Memory::ArenaData::GetPageAllocator
                           (&(pJVar7->super_ArenaAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .super_ArenaData);
            Memory::JitArenaAllocator::JitArenaAllocator
                      ((JitArenaAllocator *)local_e8,L"temp",pageAllocator,Js::Throw::OutOfMemory,
                       JsUtil::ExternalApi::RecoverUnusedMemory);
            pBVar8 = BVSparse<Memory::JitArenaAllocator>::AndNew
                               (pBStack_38,pBVar8,(JitArenaAllocator *)local_e8);
            BVSparse<Memory::JitArenaAllocator>::Dump(pBVar8);
            Memory::JitArenaAllocator::~JitArenaAllocator((JitArenaAllocator *)local_e8);
          }
          upwardExposedUses._7_1_ = false;
          upwardExposedUses._6_1_ = false;
          bVar2 = IsObjectTempVerify<ObjectTempVerify>();
          if (bVar2) {
            upwardExposedUses._7_1_ =
                 ObjectTempVerify::DependencyCheck(instr_00,pBStack_38,backwardPass);
          }
        }
      }
    }
  }
  else {
    bVar2 = ObjectTempVerify::DoTrace(backwardPass);
    if (((bVar2) && (bVar2 = BackwardPass::IsPrePass(backwardPass), !bVar2)) &&
       (bVar2 = ObjectTempVerify::CanMarkTemp(instr_00,backwardPass), bVar2)) {
      pcVar6 = ObjectTempVerify::GetTraceName();
      Output::Print(L"%s: Not temp (s%-03d):",pcVar6,(ulong)(sym->super_Sym).m_id);
      IR::Instr::DumpSimple(instr_00);
    }
  }
  ObjectTempVerify::SetDstIsTemp
            (&this->super_ObjectTempVerify,upwardExposedUses._7_1_,upwardExposedUses._6_1_,instr_00,
             backwardPass);
  return;
}

Assistant:

void
TempTracker<T>::MarkTemp(StackSym * sym, BackwardPass * backwardPass)
{
    // Don't care about type specialized syms
    Assert(sym->IsVar());

    IR::Instr * instr = backwardPass->currentInstr;
    BOOLEAN nonTemp = this->nonTempSyms.TestAndClear(sym->m_id);
    BOOLEAN isTempTransferred;
    BVSparse<JitArenaAllocator> * bvTempTransferDependencies = nullptr;

    bool const isTransferOperation =
        T::IsTempTransfer(instr)
        || T::IsTempPropertyTransferLoad(instr, backwardPass)
        || T::IsTempIndirTransferLoad(instr, backwardPass);

    if (this->tempTransferDependencies != nullptr)
    {
        // Since we don't iterate "while (!changed)" in loops, we don't have complete accurate dataflow
        // for loop carried dependencies. So don't clear the dependency transfer info.  WOOB:1121525

        // Check if this dst is transferred (assigned) to another symbol
        if (isTransferOperation)
        {
            isTempTransferred = this->tempTransferredSyms.Test(sym->m_id);
        }
        else
        {
            isTempTransferred = this->tempTransferredSyms.TestAndClear(sym->m_id);
        }

        // We only need to look at the dependencies if we are in a loop because of the back edge
        // Also we don't need to if we are in pre pass
        if (isTempTransferred)
        {
            if (!backwardPass->IsPrePass())
            {
                if (isTransferOperation)
                {
                    // Transfer operation, load but not clear the information
                    BVSparse<JitArenaAllocator> **pBv = this->tempTransferDependencies->Get(sym->m_id);
                    if (pBv)
                    {
                        bvTempTransferDependencies = *pBv;
                    }
                }
                else
                {
                    // Non transfer operation, load and clear the information and the dst value is replaced
                    bvTempTransferDependencies = this->tempTransferDependencies->GetAndClear(sym->m_id);
                }
            }
            else if (!isTransferOperation)
            {
                // In pre pass, and not a transfer operation (just an assign).  We can clear the dependency info
                // and not look at it.
                this->tempTransferDependencies->Clear(sym->m_id);
            }
        }
    }
    else
    {
        isTempTransferred = this->tempTransferredSyms.TestAndClear(sym->m_id);
    }

    // Reset the dst is temp bit (we set it optimistically on the loop pre pass)
    bool dstIsTemp = false;
    bool dstIsTempTransferred = false;

    if (nonTemp)
    {
#if DBG_DUMP
        if (T::DoTrace(backwardPass)  && !backwardPass->IsPrePass() && T::CanMarkTemp(instr, backwardPass))
        {
            Output::Print(_u("%s: Not temp (s%-03d):"), T::GetTraceName(), sym->m_id);
            instr->DumpSimple();
        }
#endif
    }
    else if (backwardPass->IsPrePass())
    {
        // On pre pass, we don't have complete information about whether it is tempable or
        // not from the back edge.  If we already discovered that it is not a temp (above), then
        // we don't mark it, other wise, assume that it is okay to be tempable and have the
        // second pass set the bit correctly.  The only works on dependency chain that is in order
        // e.g.
        //      s1 = Add
        //      s2 = s1
        //      s3 = s2
        // The dependencies tracking to catch the case whether the dependency chain is out of order
        // e.g
        //      s1 = Add
        //      s3 = s2
        //      s2 = s3

        Assert(isTransferOperation == T::IsTempTransfer(instr)
            || T::IsTempPropertyTransferLoad(instr, backwardPass)
            || T::IsTempIndirTransferLoad(instr, backwardPass));
        if (isTransferOperation)
        {
            dstIsTemp = true;
        }
    }
    else if (T::CanMarkTemp(instr, backwardPass))
    {
        dstIsTemp = true;

        if (isTempTransferred)
        {
            // Track whether the dst is transferred or not, and allocate separate stack slot for them
            // so that another dst will not overrides the value
            dstIsTempTransferred = true;

            // The temp is aliased, need to trace if there is another use of the set of aliased
            // sym that is still live so that we won't mark them this symbol and destroy the value

            if (bvTempTransferDependencies != nullptr)
            {
                // Inside a loop we need to track if any of the reg that we transferred to is still live
                //      s1 = Add
                //         = s2
                //      s2 = s1
                // Since s2 is still live on the next iteration when we reassign s1, making s1 a temp
                // will cause the value of s2 to change before it's use.

                // The upwardExposedUses are the live regs, check if it intersect with the set
                // of dependency or not.

#if DBG_DUMP
                if (T::DoTrace(backwardPass) && Js::Configuration::Global.flags.Verbose)
                {
                     Output::Print(_u("%s: Loop mark temp check instr:\n"), T::GetTraceName());
                     instr->DumpSimple();
                     Output::Print(_u("Transfer dependencies: "));
                     bvTempTransferDependencies->Dump();
                     Output::Print(_u("Upward exposed Uses  : "));
                     backwardPass->currentBlock->upwardExposedUses->Dump();
                     Output::Print(_u("\n"));
                }
#endif

                BVSparse<JitArenaAllocator> * upwardExposedUses = backwardPass->currentBlock->upwardExposedUses;
                bool hasExposedDependencies = bvTempTransferDependencies->Test(upwardExposedUses)
                    || T::HasExposedFieldDependencies(bvTempTransferDependencies, backwardPass);
                if (hasExposedDependencies)
                {
#if DBG_DUMP
                    if (T::DoTrace(backwardPass))
                    {
                        Output::Print(_u("%s: Not temp (s%-03d): "), T::GetTraceName(), sym->m_id);
                        instr->DumpSimple();
                        Output::Print(_u("       Transferred exposed uses: "));
                        JitArenaAllocator tempAllocator(_u("temp"), this->GetAllocator()->GetPageAllocator(), Js::Throw::OutOfMemory);
                        bvTempTransferDependencies->AndNew(upwardExposedUses, &tempAllocator)->Dump();
                    }
#endif

                    dstIsTemp = false;
                    dstIsTempTransferred = false;
#if DBG
                    if (IsObjectTempVerify<T>())
                    {
                        dstIsTemp = ObjectTempVerify::DependencyCheck(instr, bvTempTransferDependencies, backwardPass);
                    }
#endif
                    // Only ObjectTmepVerify would do the do anything here. All other returns false
                }
            }
        }
    }

    T::SetDstIsTemp(dstIsTemp, dstIsTempTransferred, instr, backwardPass);
}